

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int xmlCharEncOutput(xmlOutputBufferPtr output,int init)

{
  xmlBufPtr buf_00;
  xmlBufPtr buf_01;
  xmlCharEncodingHandler *pxVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  xmlChar *pxVar6;
  xmlChar *in;
  byte *pbVar7;
  uint uVar8;
  int iVar9;
  int c_out;
  int c_in;
  int local_a0;
  int len;
  xmlOutputBufferPtr local_98;
  byte *local_90;
  xmlChar charref [20];
  char buf [50];
  
  iVar9 = -1;
  if ((((output != (xmlOutputBufferPtr)0x0) && (output->encoder != (xmlCharEncodingHandlerPtr)0x0))
      && (buf_00 = output->buffer, buf_00 != (xmlBufPtr)0x0)) &&
     (buf_01 = output->conv, buf_01 != (xmlBufPtr)0x0)) {
    iVar9 = 0;
    local_98 = output;
    do {
      while( true ) {
        sVar4 = xmlBufAvail(buf_01);
        if (init != 0) {
          c_in = 0;
          c_out = (int)sVar4;
          pxVar1 = local_98->encoder;
          pxVar6 = xmlBufEnd(buf_01);
          xmlEncOutputChunk(pxVar1,pxVar6,&c_out,(uchar *)0x0,&c_in);
          xmlBufAddLen(buf_01,(long)c_out);
          return c_out;
        }
        sVar5 = xmlBufUse(buf_00);
        if (sVar5 == 0) {
          return iVar9;
        }
        if (0xffff < sVar5) {
          sVar5 = 0x10000;
        }
        uVar8 = (int)sVar5 * 4;
        if (sVar4 <= uVar8) {
          xmlBufGrow(buf_01,uVar8);
          sVar4 = xmlBufAvail(buf_01);
        }
        if (0x3ffff < sVar4) {
          sVar4 = 0x40000;
        }
        c_out = (int)sVar4;
        pxVar1 = local_98->encoder;
        c_in = (int)sVar5;
        pxVar6 = xmlBufEnd(buf_01);
        in = xmlBufContent(buf_00);
        iVar2 = xmlEncOutputChunk(pxVar1,pxVar6,&c_out,in,&c_in);
        xmlBufShrink(buf_00,(long)c_in);
        xmlBufAddLen(buf_01,(long)c_out);
        iVar9 = iVar9 + c_out;
        if (iVar2 != -2) break;
        sVar4 = xmlBufUse(buf_00);
        len = (int)sVar4;
        pbVar7 = xmlBufContent(buf_00);
        uVar8 = xmlGetUTF8Char(pbVar7,&len);
        if ((int)uVar8 < 1) {
          iVar2 = -2;
          goto LAB_00143ef1;
        }
        local_a0 = iVar9;
        local_90 = pbVar7;
        iVar9 = snprintf((char *)charref,0x14,"&#%d;",(ulong)uVar8);
        xmlBufShrink(buf_00,(long)len);
        xmlBufGrow(buf_01,iVar9 * 4);
        sVar4 = xmlBufAvail(buf_01);
        c_out = (int)sVar4;
        pxVar1 = local_98->encoder;
        c_in = iVar9;
        pxVar6 = xmlBufEnd(buf_01);
        iVar2 = xmlEncOutputChunk(pxVar1,pxVar6,&c_out,charref,&c_in);
        pbVar7 = local_90;
        if ((iVar2 < 0) || (c_in != iVar9)) {
          snprintf(buf,0x31,"0x%02X 0x%02X 0x%02X 0x%02X",(ulong)*local_90,(ulong)local_90[1],
                   (ulong)local_90[2],(uint)local_90[3]);
          buf[0x31] = '\0';
          xmlEncodingErr(XML_I18N_CONV_FAILED,
                         "output conversion failed due to conv error, bytes %s\n",buf);
          iVar3 = xmlBufGetAllocationScheme(buf_00);
          iVar9 = local_a0;
          if (iVar3 != 2) {
            *pbVar7 = 0x20;
          }
          goto LAB_00143ef1;
        }
        xmlBufAddLen(buf_01,(long)c_out);
        iVar9 = local_a0 + c_out;
      }
      if (iVar2 != -1) {
        if (iVar2 == -4) {
          xmlEncodingErr(XML_I18N_NO_OUTPUT,"xmlCharEncOutFunc: no output function !\n",(char *)0x0)
          ;
          iVar2 = -1;
        }
        goto LAB_00143ef1;
      }
    } while (0 < c_out);
    iVar2 = -3;
LAB_00143ef1:
    if (iVar9 == 0) {
      iVar9 = iVar2;
    }
  }
  return iVar9;
}

Assistant:

int
xmlCharEncOutput(xmlOutputBufferPtr output, int init)
{
    int ret;
    size_t written;
    int writtentot = 0;
    size_t toconv;
    int c_in;
    int c_out;
    xmlBufPtr in;
    xmlBufPtr out;

    if ((output == NULL) || (output->encoder == NULL) ||
        (output->buffer == NULL) || (output->conv == NULL))
        return (-1);
    out = output->conv;
    in = output->buffer;

retry:

    written = xmlBufAvail(out);

    /*
     * First specific handling of the initialization call
     */
    if (init) {
        c_in = 0;
        c_out = written;
        /* TODO: Check return value. */
        xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                          NULL, &c_in);
        xmlBufAddLen(out, c_out);
#ifdef DEBUG_ENCODING
	xmlGenericError(xmlGenericErrorContext,
		"initialized encoder\n");
#endif
        return(c_out);
    }

    /*
     * Conversion itself.
     */
    toconv = xmlBufUse(in);
    if (toconv == 0)
        return (writtentot);
    if (toconv > 64 * 1024)
        toconv = 64 * 1024;
    if (toconv * 4 >= written) {
        xmlBufGrow(out, toconv * 4);
        written = xmlBufAvail(out);
    }
    if (written > 256 * 1024)
        written = 256 * 1024;

    c_in = toconv;
    c_out = written;
    ret = xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                            xmlBufContent(in), &c_in);
    xmlBufShrink(in, c_in);
    xmlBufAddLen(out, c_out);
    writtentot += c_out;
    if (ret == -1) {
        if (c_out > 0) {
            /* Can be a limitation of iconv or uconv */
            goto retry;
        }
        ret = -3;
    }

    /*
     * Attempt to handle error cases
     */
    switch (ret) {
        case 0:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,
		    "converted %d bytes to %d bytes of output\n",
	            c_in, c_out);
#endif
	    break;
        case -1:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,
		    "output conversion failed by lack of space\n");
#endif
	    break;
        case -3:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,"converted %d bytes to %d bytes of output %d left\n",
	            c_in, c_out, (int) xmlBufUse(in));
#endif
	    break;
        case -4:
            xmlEncodingErr(XML_I18N_NO_OUTPUT,
                           "xmlCharEncOutFunc: no output function !\n", NULL);
            ret = -1;
            break;
        case -2: {
	    xmlChar charref[20];
	    int len = xmlBufUse(in);
            xmlChar *content = xmlBufContent(in);
	    int cur, charrefLen;

	    cur = xmlGetUTF8Char(content, &len);
	    if (cur <= 0)
                break;

#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                    "handling output conversion error\n");
            xmlGenericError(xmlGenericErrorContext,
                    "Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",
                    content[0], content[1],
                    content[2], content[3]);
#endif
            /*
             * Removes the UTF8 sequence, and replace it by a charref
             * and continue the transcoding phase, hoping the error
             * did not mangle the encoder state.
             */
            charrefLen = snprintf((char *) &charref[0], sizeof(charref),
                             "&#%d;", cur);
            xmlBufShrink(in, len);
            xmlBufGrow(out, charrefLen * 4);
            c_out = xmlBufAvail(out);
            c_in = charrefLen;
            ret = xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                                    charref, &c_in);

	    if ((ret < 0) || (c_in != charrefLen)) {
		char buf[50];

		snprintf(&buf[0], 49, "0x%02X 0x%02X 0x%02X 0x%02X",
			 content[0], content[1],
			 content[2], content[3]);
		buf[49] = 0;
		xmlEncodingErr(XML_I18N_CONV_FAILED,
		    "output conversion failed due to conv error, bytes %s\n",
			       buf);
		if (xmlBufGetAllocationScheme(in) != XML_BUFFER_ALLOC_IMMUTABLE)
		    content[0] = ' ';
                break;
	    }

            xmlBufAddLen(out, c_out);
            writtentot += c_out;
            goto retry;
	}
    }
    return(writtentot ? writtentot : ret);
}